

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall nuraft::asio_service::create_client(asio_service *this)

{
  long in_RSI;
  
  create_client(this,(string *)(in_RSI + -8));
  return;
}

Assistant:

ptr<rpc_client> asio_service::create_client(const std::string& endpoint) {
    // NOTE:
    //   Abandoned regular expression due to bug in GCC < 4.9.
    //   And also support `endpoint` which doesn't start with `tcp://`.
#if 0
    // the endpoint is expecting to be protocol://host:port,
    // and we only support tcp for this factory
    // which is endpoint must be tcp://hostname:port
    static std::regex reg("^tcp://(([a-zA-Z0-9\\-]+\\.)*([a-zA-Z0-9]+)):([0-9]+)$");
    std::smatch mresults;
    if (!std::regex_match(endpoint, mresults, reg) || mresults.size() != 5) {
        return ptr<rpc_client>();
    }
#endif
    bool valid_address = false;
    std::string hostname;
    std::string port;
    size_t pos = endpoint.rfind(":");
    do {
        if (pos == std::string::npos) break;
        int port_num = std::stoi( endpoint.substr(pos + 1) );
        if (!port_num) break;
        port = std::to_string( port_num );

        size_t pos2 = endpoint.rfind("://", pos - 1);
        hostname = (pos2 == std::string::npos)
                   ? endpoint.substr(0, pos)
                   : endpoint.substr(pos2 + 3, pos - pos2 - 3);

        if (hostname.empty()) break;
        valid_address = true;

    } while (false);

    if (!valid_address) {
        p_er("invalid endpoint: %s", endpoint.c_str());
        return ptr<rpc_client>();
    }

    return cs_new< asio_rpc_client >
                 ( impl_,
                   impl_->io_svc_,
                   impl_->ssl_client_ctx_,
                   hostname,
                   port,
                   impl_->my_opt_.enable_ssl_,
                   l_ );
}